

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::RewindLoopFixedCont::Exec
          (RewindLoopFixedCont *this,Matcher *matcher,Char *input,CharCount *inputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BeginLoopFixedInst *pBVar4;
  LoopInfo *pLVar5;
  undefined4 *puVar6;
  uint8 *puVar7;
  
  Matcher::QueryContinue(matcher,qcTicks);
  pBVar4 = Matcher::LabelToInstPointer<UnifiedRegex::BeginLoopFixedInst>
                     (matcher,BeginLoopFixed,*(Label *)&(this->super_Cont).field_0xc);
  pLVar5 = Matcher::LoopIdToLoopInfo
                     (matcher,(pBVar4->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId);
  if (this->tryingBody == true) {
    this->tryingBody = false;
    uVar3 = pLVar5->number;
    if (uVar3 < (pBVar4->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x1245,"(loopInfo->number >= begin->repeats.lower)",
                         "loopInfo->number >= begin->repeats.lower");
      if (!bVar2) {
LAB_00d497d4:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
      uVar3 = pLVar5->number;
    }
  }
  else {
    uVar3 = pLVar5->number;
    if (uVar3 <= (pBVar4->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x124a,"(loopInfo->number > begin->repeats.lower)",
                         "loopInfo->number > begin->repeats.lower");
      if (!bVar2) goto LAB_00d497d4;
      *puVar6 = 0;
      uVar3 = pLVar5->number;
    }
    uVar3 = uVar3 - 1;
    pLVar5->number = uVar3;
  }
  *inputOffset = uVar3 * (pBVar4->super_FixedLengthMixin).length + pLVar5->startInputOffset;
  if ((pBVar4->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower < pLVar5->number) {
    ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
    UnPop<UnifiedRegex::RewindLoopFixedCont>
              (&contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    Matcher::UnPopStats(matcher,contStack,input);
  }
  puVar7 = Matcher::LabelToInstPointer(matcher,(pBVar4->super_BeginLoopMixin).exitLabel);
  *instPointer = puVar7;
  return true;
}

Assistant:

inline bool RewindLoopFixedCont::Exec(REGEX_CONT_EXEC_PARAMETERS)
    {
        matcher.QueryContinue(qcTicks);

        BeginLoopFixedInst* begin = matcher.L2I(BeginLoopFixed, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        if (tryingBody)
        {
            tryingBody = false;
            // loopInfo->number is the number of iterations completed before trying body
            Assert(loopInfo->number >= begin->repeats.lower);
        }
        else
        {
            // loopInfo->number is the number of iterations completed before trying follow
            Assert(loopInfo->number > begin->repeats.lower);
            // Try follow with one fewer iteration
            loopInfo->number--;
        }

        // Rewind input
        inputOffset = loopInfo->startInputOffset + loopInfo->number * begin->length;

        if (loopInfo->number > begin->repeats.lower)
        {
            // Un-pop the continuation ready for next time
            contStack.UnPop<RewindLoopFixedCont>();
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.UnPopStats(contStack, input);
#endif
        }
        // else: Can't try any fewer iterations if follow fails, so leave continuation as popped and let failure propagate

        instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        return true; // STOP BACKTRACKING
    }